

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgqueue.c
# Opt level: O1

void nni_msgq_aio_get(nni_msgq *mq,nni_aio *aio)

{
  nni_list *list;
  uint uVar1;
  _Bool _Var2;
  nni_aio *aio_00;
  nni_aio *aio_01;
  nni_msg *m;
  size_t count;
  uint uVar3;
  
  nni_mtx_lock(&mq->mq_lock);
  _Var2 = nni_aio_start(aio,nni_msgq_cancel,mq);
  if (_Var2) {
    list = &mq->mq_aio_getq;
    nni_aio_list_append(list,aio);
    aio_00 = (nni_aio *)nni_list_first(list);
    if (aio_00 != (nni_aio *)0x0) {
      do {
        if (mq->mq_len == 0) {
          aio_01 = (nni_aio *)nni_list_first(&mq->mq_aio_putq);
          if (aio_01 == (nni_aio *)0x0) break;
          m = nni_aio_get_msg(aio_01);
          count = nni_msg_len(m);
          nni_aio_set_msg(aio_01,(nni_msg *)0x0);
          nni_aio_list_remove(aio_01);
          nni_aio_finish(aio_01,NNG_OK,count);
        }
        else {
          uVar1 = mq->mq_get;
          uVar3 = uVar1 + 1;
          mq->mq_get = uVar3;
          if (uVar3 == mq->mq_alloc) {
            uVar3 = 0;
          }
          m = mq->mq_msgs[uVar1];
          mq->mq_get = uVar3;
          mq->mq_len = mq->mq_len - 1;
        }
        nni_aio_list_remove(aio_00);
        nni_aio_finish_msg(aio_00,m);
        aio_00 = (nni_aio *)nni_list_first(list);
      } while (aio_00 != (nni_aio *)0x0);
    }
    nni_msgq_run_notify(mq);
  }
  nni_mtx_unlock(&mq->mq_lock);
  return;
}

Assistant:

void
nni_msgq_aio_get(nni_msgq *mq, nni_aio *aio)
{
	nni_mtx_lock(&mq->mq_lock);
	if (!nni_aio_start(aio, nni_msgq_cancel, mq)) {
		nni_mtx_unlock(&mq->mq_lock);
		return;
	}

	nni_aio_list_append(&mq->mq_aio_getq, aio);
	nni_msgq_run_getq(mq);
	nni_msgq_run_notify(mq);

	nni_mtx_unlock(&mq->mq_lock);
}